

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall leveldb::VersionSet::Finalize(VersionSet *this,Version *v)

{
  int iVar1;
  int64_t iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int level;
  ulong uVar7;
  double result;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  
  iVar6 = -1;
  uVar7 = 0;
  dVar10 = -1.0;
  do {
    if (uVar7 == 0) {
      lVar3 = (long)v->files_[0].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)v->files_[0].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar3 >> 3;
      auVar9._8_4_ = (int)(lVar3 >> 0x23);
      auVar9._0_8_ = lVar4;
      auVar9._12_4_ = 0x45300000;
      dVar8 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * 0.25;
      iVar1 = 0;
    }
    else {
      if (uVar7 == 6) {
        v->compaction_level_ = iVar6;
        v->compaction_score_ = dVar10;
        return;
      }
      iVar2 = TotalFileSize(v->files_ + uVar7);
      dVar8 = 10485760.0;
      for (uVar5 = uVar7 & 0xffffffff; 1 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1)) {
        dVar8 = dVar8 * 10.0;
      }
      auVar11._8_4_ = (int)((ulong)iVar2 >> 0x20);
      auVar11._0_8_ = iVar2;
      auVar11._12_4_ = 0x45300000;
      dVar8 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)iVar2) - 4503599627370496.0)) / dVar8;
      iVar1 = (int)uVar7;
    }
    if (dVar8 <= dVar10) {
      dVar8 = dVar10;
      iVar1 = iVar6;
    }
    iVar6 = iVar1;
    uVar7 = uVar7 + 1;
    dVar10 = dVar8;
  } while( true );
}

Assistant:

void VersionSet::Finalize(Version* v) {
  // Precomputed best level for next compaction
  int best_level = -1;
  double best_score = -1;

  for (int level = 0; level < config::kNumLevels - 1; level++) {
    double score;
    if (level == 0) {
      // We treat level-0 specially by bounding the number of files
      // instead of number of bytes for two reasons:
      //
      // (1) With larger write-buffer sizes, it is nice not to do too
      // many level-0 compactions.
      //
      // (2) The files in level-0 are merged on every read and
      // therefore we wish to avoid too many files when the individual
      // file size is small (perhaps because of a small write-buffer
      // setting, or very high compression ratios, or lots of
      // overwrites/deletions).
      score = v->files_[level].size() /
              static_cast<double>(config::kL0_CompactionTrigger);
    } else {
      // Compute the ratio of current size to size limit.
      const uint64_t level_bytes = TotalFileSize(v->files_[level]);
      score =
          static_cast<double>(level_bytes) / MaxBytesForLevel(options_, level);
    }

    if (score > best_score) {
      best_level = level;
      best_score = score;
    }
  }

  v->compaction_level_ = best_level;
  v->compaction_score_ = best_score;
}